

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O0

int __thiscall
FTGATexture::CopyTrueColorPixels
          (FTGATexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  bool bVar1;
  int local_5c8 [2];
  int local_5c0;
  int local_5b8;
  FResourceLump **local_5b0;
  PalEntry local_5a8 [2];
  undefined4 local_5a0;
  undefined4 local_598;
  undefined4 local_590;
  int local_57c;
  BYTE *local_578;
  undefined1 *local_570;
  uint local_564;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  uint local_540;
  uint local_53c;
  BYTE *local_538;
  FileReader *local_530;
  FileReader *local_528;
  FileReader *local_520;
  FileReader *local_518;
  FileReader *local_510;
  uint local_508;
  bool local_501;
  FWadLump *local_500;
  FResourceLump **local_4f8;
  FTGATexture *local_4f0;
  PalEntry *local_4e8;
  FResourceLump **local_4e0;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_4d8;
  int local_4d4;
  int local_4d0;
  int i_1;
  int Pitch;
  int step_x;
  BYTE *ptr;
  int Size;
  int i;
  int local_4a4;
  BYTE *pBStack_4a0;
  int transval;
  BYTE *sbuffer;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  WORD w;
  TGAHeader hdr;
  FWadLump lump;
  PalEntry pe [256];
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FTGATexture *this_local;
  
  local_4e0 = &lump.Lump;
  local_4e8 = pe + 0xfe;
  local_4f0 = this;
  pe._1016_8_ = inf;
  do {
    local_4f8 = local_4e0;
    PalEntry::PalEntry((PalEntry *)local_4e0);
    local_4e0 = (FResourceLump **)((long)local_4f8 + 4);
  } while ((PalEntry *)local_4e0 != local_4e8);
  local_500 = (FWadLump *)&hdr.y_origin;
  FWadCollection::OpenLumpNum(local_500,&Wads,(local_4f0->super_FTexture).SourceLump);
  local_4a4 = 0;
  FWadLump::Read(local_500,(void *)((long)&sbuffer + 6),0x12);
  FWadLump::Seek((FWadLump *)&hdr.y_origin,(ulong)sbuffer._6_1_,1);
  if (sbuffer._7_1_ != '\0') {
    memset(&lump.Lump,0,0x400);
    for (Size = (int)_b; bVar1 = Size < (int)_b + (int)_r, local_501 = bVar1 && Size < 0x100,
        bVar1 && Size < 0x100; Size = Size + 1) {
      local_508 = (uint)w._1_1_;
      if (local_508 - 0xf < 2) {
        FileReader::operator>>((FileReader *)&hdr.y_origin,(WORD *)((long)&sbuffer + 4));
        sbuffer._3_1_ = (BYTE)((sbuffer._4_2_ & 0x1f) << 3);
        sbuffer._2_1_ = (BYTE)((int)(sbuffer._4_2_ & 0x3e0) >> 2);
        sbuffer._1_1_ = (BYTE)((int)(sbuffer._4_2_ & 0x7c00) >> 7);
        sbuffer._0_1_ = 0xff;
      }
      else if (local_508 == 0x18) {
        local_510 = FileReader::operator>>((FileReader *)&hdr.y_origin,(BYTE *)((long)&sbuffer + 1))
        ;
        local_518 = FileReader::operator>>(local_510,(BYTE *)((long)&sbuffer + 2));
        FileReader::operator>>(local_518,(BYTE *)((long)&sbuffer + 3));
        sbuffer._0_1_ = 0xff;
      }
      else if (local_508 == 0x20) {
        local_520 = FileReader::operator>>((FileReader *)&hdr.y_origin,(BYTE *)((long)&sbuffer + 1))
        ;
        local_528 = FileReader::operator>>(local_520,(BYTE *)((long)&sbuffer + 2));
        local_530 = FileReader::operator>>(local_528,(BYTE *)((long)&sbuffer + 3));
        FileReader::operator>>(local_530,(BYTE *)&sbuffer);
        if ((hdr.x_origin._1_1_ & 0xf) == 8) {
          if (((BYTE)sbuffer != '\0') && ((BYTE)sbuffer != 0xff)) {
            local_4a4 = 1;
          }
        }
        else {
          sbuffer._0_1_ = 0xff;
        }
      }
      else {
        sbuffer._0_1_ = '\0';
        sbuffer._1_1_ = '\0';
        sbuffer._2_1_ = '\0';
        sbuffer._3_1_ = '\0';
      }
      PalEntry::PalEntry((PalEntry *)((long)&ptr + 4),(BYTE)sbuffer,sbuffer._3_1_,sbuffer._2_1_,
                         sbuffer._1_1_);
      pe[(long)Size + -2].field_0 = ptr._4_4_;
    }
  }
  ptr._0_4_ = (uint)(local_4f0->super_FTexture).Width * (uint)(local_4f0->super_FTexture).Height *
              (uint)((byte)hdr.x_origin >> 3);
  local_538 = (BYTE *)operator_new__((long)(int)ptr);
  pBStack_4a0 = local_538;
  if (a < 4) {
    FWadLump::Read((FWadLump *)&hdr.y_origin,local_538,(long)(int)ptr);
  }
  else {
    ReadCompressed(local_4f0,(FileReader *)&hdr.y_origin,local_538,(uint)((byte)hdr.x_origin >> 3));
  }
  _Pitch = pBStack_4a0;
  i_1 = (int)(uint)(byte)hdr.x_origin >> 3;
  local_4d0 = (uint)(local_4f0->super_FTexture).Width * i_1;
  if ((hdr.x_origin._1_1_ & 0x20) == 0) {
    _Pitch = pBStack_4a0 + (int)(((local_4f0->super_FTexture).Height - 1) * local_4d0);
    local_4d0 = -local_4d0;
  }
  local_53c = a & 7;
  if (local_53c == 1) {
    local_5a8[0].field_0 = pe[0xfe].field_0;
    local_5a8[1].field_0 = pe[0xff].field_0;
    local_5b0 = &lump.Lump;
    local_5c0 = local_4d0;
    local_5c8[0] = i_1;
    local_5b8 = rotate;
    (*bmp->_vptr_FBitmap[3])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width,
               (ulong)(local_4f0->super_FTexture).Height);
  }
  else if (local_53c == 2) {
    local_540 = (uint)(byte)hdr.x_origin;
    if (local_540 - 0xf < 2) {
      local_5a8[0].field_0 = pe[0xfe].field_0;
      local_5a8[1].field_0 = pe[0xff].field_0;
      local_5c0 = local_4d0;
      local_590 = 0;
      local_598 = 0;
      local_5a0 = 0;
      local_5b0 = (FResourceLump **)CONCAT44(local_5b0._4_4_,8);
      local_5c8[0] = i_1;
      local_5b8 = rotate;
      local_548 = (undefined1 *)local_5c8;
      (*bmp->_vptr_FBitmap[2])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width,
                 (ulong)(local_4f0->super_FTexture).Height);
    }
    else if (local_540 == 0x18) {
      local_5a8[0].field_0 = pe[0xfe].field_0;
      local_5a8[1].field_0 = pe[0xff].field_0;
      local_5c0 = local_4d0;
      local_590 = 0;
      local_598 = 0;
      local_5a0 = 0;
      local_5b0 = (FResourceLump **)CONCAT44(local_5b0._4_4_,5);
      local_5c8[0] = i_1;
      local_5b8 = rotate;
      local_550 = (undefined1 *)local_5c8;
      (*bmp->_vptr_FBitmap[2])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width,
                 (ulong)(local_4f0->super_FTexture).Height);
    }
    else if (local_540 == 0x20) {
      if ((hdr.x_origin._1_1_ & 0xf) == 8) {
        local_5a8[0].field_0 = pe[0xfe].field_0;
        local_5a8[1].field_0 = pe[0xff].field_0;
        local_5c0 = local_4d0;
        local_590 = 0;
        local_598 = 0;
        local_5a0 = 0;
        local_5b0 = (FResourceLump **)CONCAT44(local_5b0._4_4_,6);
        local_5c8[0] = i_1;
        local_5b8 = rotate;
        local_560 = (undefined1 *)local_5c8;
        (*bmp->_vptr_FBitmap[2])
                  (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width
                   ,(ulong)(local_4f0->super_FTexture).Height);
        local_4a4 = -1;
      }
      else {
        local_5a8[0].field_0 = pe[0xfe].field_0;
        local_5a8[1].field_0 = pe[0xff].field_0;
        local_5c0 = local_4d0;
        local_590 = 0;
        local_598 = 0;
        local_5a0 = 0;
        local_5b0 = (FResourceLump **)CONCAT44(local_5b0._4_4_,5);
        local_5c8[0] = i_1;
        local_5b8 = rotate;
        local_558 = (undefined1 *)local_5c8;
        (*bmp->_vptr_FBitmap[2])
                  (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width
                   ,(ulong)(local_4f0->super_FTexture).Height);
      }
    }
  }
  else if (local_53c == 3) {
    local_564 = (uint)(byte)hdr.x_origin;
    if (local_564 == 8) {
      for (local_4d4 = 0; local_4d4 < 0x100; local_4d4 = local_4d4 + 1) {
        PalEntry::PalEntry((PalEntry *)&local_4d8.field_0,0xff,(BYTE)local_4d4,(BYTE)local_4d4,
                           (BYTE)local_4d4);
        pe[(long)local_4d4 + -2].field_0 = local_4d8;
      }
      local_5a8[0].field_0 = pe[0xfe].field_0;
      local_5a8[1].field_0 = pe[0xff].field_0;
      local_5b0 = &lump.Lump;
      local_5c0 = local_4d0;
      local_5c8[0] = i_1;
      local_5b8 = rotate;
      (*bmp->_vptr_FBitmap[3])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width,
                 (ulong)(local_4f0->super_FTexture).Height);
    }
    else if (local_564 == 0x10) {
      local_5a8[0].field_0 = pe[0xfe].field_0;
      local_5a8[1].field_0 = pe[0xff].field_0;
      local_5c0 = local_4d0;
      local_590 = 0;
      local_598 = 0;
      local_5a0 = 0;
      local_5b0 = (FResourceLump **)CONCAT44(local_5b0._4_4_,7);
      local_5c8[0] = i_1;
      local_5b8 = rotate;
      local_570 = (undefined1 *)local_5c8;
      (*bmp->_vptr_FBitmap[2])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,_Pitch,(ulong)(local_4f0->super_FTexture).Width,
                 (ulong)(local_4f0->super_FTexture).Height);
    }
  }
  local_578 = pBStack_4a0;
  if (pBStack_4a0 != (BYTE *)0x0) {
    operator_delete__(pBStack_4a0);
  }
  local_57c = local_4a4;
  FWadLump::~FWadLump((FWadLump *)&hdr.y_origin);
  return local_57c;
}

Assistant:

int FTGATexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * sbuffer;
	int transval = 0;

	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(pe, 0, 256*sizeof(PalEntry));
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				else if (a!=0 && a!=255) transval = true;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			pe[i] = PalEntry(a, r, g, b);
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	sbuffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(sbuffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, sbuffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = sbuffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_RGB555, inf);
			break;
		
		case 24:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			}
			else
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGRA, inf);
				transval = -1;
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// gray map
			bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
			break;
		
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_I16, inf);
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] sbuffer;
	return transval;
}